

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void * tlb_vaddr_to_host_aarch64
                 (CPUArchState_conflict1 *env,abi_ptr addr,MMUAccessType access_type,int mmu_idx)

{
  uc_struct_conflict2 *puVar1;
  TargetPageBits_conflict *pTVar2;
  _Bool _Var3;
  char cVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong index;
  void *pvVar8;
  ulong uVar9;
  uc_struct_conflict2 *uc;
  long lVar10;
  long lVar11;
  CPUARMState_conflict *__mptr;
  
  puVar1 = env->uc;
  pTVar2 = puVar1->init_target_page;
  if (MMU_INST_FETCH < access_type) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
               ,0x4f9,(char *)0x0);
  }
  lVar10 = (long)mmu_idx * 0x10;
  index = addr >> ((byte)pTVar2->bits & 0x3f) & *(ulong *)((long)env + lVar10 + -0xd0) >> 6;
  lVar11 = *(long *)((long)env + lVar10 + -200) + index * 0x40;
  uVar9 = (ulong)access_type;
  uVar6 = pTVar2->mask;
  uVar7 = *(ulong *)(lVar11 + uVar9 * 8);
  if (((uVar6 | 0x200) & uVar7) != (uVar6 & addr)) {
    _Var3 = victim_tlb_hit(env,(long)mmu_idx,index,uVar9 * 8,uVar6 & addr);
    if (_Var3) {
      puVar5 = (ulong *)(lVar11 + uVar9 * 8);
    }
    else {
      cVar4 = (**(code **)(env[-1].vfp.zregs[4].d[2] + 0x48))
                        (env[-4].vfp.zregs[0x17].d + 0x14,addr,0,access_type,mmu_idx,1,0);
      if (cVar4 == '\0') {
        return (void *)0x0;
      }
      lVar11 = (addr >> ((byte)env->uc->init_target_page->bits & 0x3f) &
               *(ulong *)((long)env + lVar10 + -0xd0) >> 6) * 0x40 +
               *(long *)((long)env + lVar10 + -200);
      puVar5 = (ulong *)(lVar11 + uVar9 * 8);
    }
    uVar7 = *puVar5;
    uVar6 = puVar1->init_target_page->mask;
  }
  if ((uVar7 & ~uVar6) == 0) {
    pvVar8 = (void *)(addr + *(long *)(lVar11 + 0x20));
  }
  else {
    pvVar8 = (void *)0x0;
  }
  return pvVar8;
}

Assistant:

void *tlb_vaddr_to_host(CPUArchState *env, abi_ptr addr,
                        MMUAccessType access_type, int mmu_idx)
{
    struct uc_struct *uc = env->uc;
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr, page;
    size_t elt_ofs = 0;

    switch (access_type) {
    case MMU_DATA_LOAD:
        elt_ofs = offsetof(CPUTLBEntry, addr_read);
        break;
    case MMU_DATA_STORE:
        elt_ofs = offsetof(CPUTLBEntry, addr_write);
        break;
    case MMU_INST_FETCH:
        elt_ofs = offsetof(CPUTLBEntry, addr_code);
        break;
    default:
        g_assert_not_reached();
    }

    page = addr & TARGET_PAGE_MASK;
    tlb_addr = tlb_read_ofs(entry, elt_ofs);

    if (!tlb_hit_page(uc, tlb_addr, page)) {
        uintptr_t index = tlb_index(env, mmu_idx, addr);

        if (!victim_tlb_hit(env, mmu_idx, index, elt_ofs, page)) {
            CPUState *cs = env_cpu(env);
            CPUClass *cc = CPU_GET_CLASS(cs);

            if (!cc->tlb_fill(cs, addr, 0, access_type, mmu_idx, true, 0)) {
                /* Non-faulting page table read failed.  */
                return NULL;
            }

            /* TLB resize via tlb_fill may have moved the entry.  */
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_read_ofs(entry, elt_ofs);
    }

    if (tlb_addr & ~TARGET_PAGE_MASK) {
        /* IO access */
        return NULL;
    }

    return (void *)((uintptr_t)addr + entry->addend);
}